

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O3

Clause * __thiscall LinearGE<1,_1>::explain(LinearGE<1,_1> *this,Lit param_1,int inf_id)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Clause *this_00;
  Lit *pLVar7;
  size_t __size;
  ulong uVar8;
  long lVar9;
  Clause *c;
  Clause *local_38;
  
  uVar1 = (this->x).sz;
  uVar2 = (this->y).sz;
  uVar3 = (this->r).v;
  uVar4 = uVar1;
  if (sat.assigns.data[uVar3] != 0) {
    ((this->ps).data)->x = (uint)((byte)sat.assigns.data[uVar3] < 0xfe) + uVar3 * 2;
    uVar4 = (this->x).sz;
  }
  if (uVar4 != 0) {
    lVar9 = 0;
    uVar8 = 0;
    do {
      iVar5 = (**(code **)(**(long **)((long)&((this->x).data)->var + lVar9) + 0x48))();
      (this->ps).data[uVar8 + 1].x = iVar5;
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 0x10;
    } while (uVar8 < (this->x).sz);
  }
  if ((this->y).sz == 0) {
    pLVar7 = (this->ps).data;
  }
  else {
    lVar9 = 0;
    uVar8 = 0;
    do {
      iVar6 = (**(code **)(**(long **)((long)&((this->y).data)->var + lVar9) + 0x40))();
      iVar5 = (int)uVar8;
      uVar8 = uVar8 + 1;
      pLVar7 = (this->ps).data;
      pLVar7[iVar5 + (this->x).sz + 1].x = iVar6;
      lVar9 = lVar9 + 0x10;
    } while (uVar8 < (this->y).sz);
  }
  uVar8 = (ulong)(inf_id + 1);
  if (uVar2 + uVar1 == inf_id) {
    uVar8 = 0;
  }
  pLVar7[uVar8].x = pLVar7->x;
  uVar1 = (this->ps).sz;
  __size = 8;
  if (uVar1 != 0) {
    __size = (ulong)(uVar1 - 1) * 4 + 8;
  }
  this_00 = (Clause *)malloc(__size);
  Clause::Clause<vec<Lit>>(this_00,&this->ps,false);
  *(byte *)this_00 = *(byte *)this_00 | 2;
  local_38 = this_00;
  vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_38);
  return local_38;
}

Assistant:

Clause* explain(Lit /*p*/, int inf_id) override {
		if (inf_id == static_cast<int>(x.size() + y.size())) {
			inf_id = -1;
		}
		if ((R != 0) && r.isFixed()) {
			ps[0] = r.getValLit();
		}
		for (unsigned int i = 0; i < x.size(); i++) {
			ps[i + R] = x[i].getMaxLit();
		}
		for (unsigned int i = 0; i < y.size(); i++) {
			ps[i + R + x.size()] = y[i].getMaxLit();
		}
		ps[R + inf_id] = ps[0];
		return Reason_new(ps);
	}